

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O3

void aom_quantize_b_adaptive_helper_c
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan,qm_val_t *qm_ptr,qm_val_t *iqm_ptr,int log_scale)

{
  short sVar1;
  uint uVar2;
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  int local_64 [4];
  int local_54;
  int local_50 [2];
  int16_t *local_48;
  int16_t *local_40;
  int16_t *local_38;
  
  bVar4 = (byte)log_scale;
  local_64[2] = (1 << (bVar4 & 0x1f)) >> 1;
  local_64[0] = *zbin_ptr + local_64[2] >> (bVar4 & 0x1f);
  local_64[3] = -local_64[0];
  local_64[1] = zbin_ptr[1] + local_64[2] >> (bVar4 & 0x1f);
  local_54 = -local_64[1];
  local_48 = round_ptr;
  local_40 = quant_ptr;
  local_38 = quant_shift_ptr;
  memset(qcoeff_ptr,0,n_coeffs * 4);
  memset(dqcoeff_ptr,0,n_coeffs * 4);
  local_50[0] = *dequant_ptr * 0x145 + 0x40 >> 7;
  local_50[1] = dequant_ptr[1] * 0x145 + 0x40 >> 7;
  uVar3 = n_coeffs & 0xffffffff;
  do {
    uVar2 = (uint)uVar3;
    if ((int)uVar2 < 1) goto LAB_0026d3e0;
    sVar1 = scan[uVar3 - 1];
    if (qm_ptr == (qm_val_t *)0x0) {
      uVar6 = 0x20;
    }
    else {
      uVar6 = (uint)qm_ptr[sVar1];
    }
    uVar11 = (ulong)((uint)(sVar1 != 0) * 4);
    iVar10 = *(int *)((long)local_64 + uVar11 + 0x14);
  } while (((int)(uVar6 * coeff_ptr[sVar1]) < *(int *)((long)local_64 + uVar11) * 0x20 + iVar10) &&
          (uVar3 = uVar3 - 1,
          local_64[(ulong)(sVar1 != 0) + 3] * 0x20 - iVar10 < (int)(uVar6 * coeff_ptr[sVar1])));
  uVar3 = 0xffffffff;
  uVar11 = 0;
  uVar6 = 0xffffffff;
  do {
    sVar1 = scan[uVar11];
    iVar10 = coeff_ptr[sVar1];
    iVar9 = -iVar10;
    if (0 < iVar10) {
      iVar9 = iVar10;
    }
    if (qm_ptr == (qm_val_t *)0x0) {
      bVar5 = 0x20;
    }
    else {
      bVar5 = qm_ptr[sVar1];
    }
    bVar14 = sVar1 != 0;
    if (local_64[bVar14] * 0x20 <= (int)(iVar9 * (uint)bVar5)) {
      uVar13 = (ulong)((uint)bVar14 * 2);
      iVar9 = (*(short *)((long)local_48 + uVar13) + local_64[2] >> (bVar4 & 0x1f)) + iVar9;
      if (0x7ffe < iVar9) {
        iVar9 = 0x7fff;
      }
      if (iVar9 < -0x7fff) {
        iVar9 = -0x8000;
      }
      uVar8 = iVar10 >> 0x1f;
      uVar12 = (uint)((long)((long)*(short *)((long)local_38 + uVar13) *
                            (((long)((long)*(short *)((long)local_40 + uVar13) *
                                    (ulong)bVar5 * (long)iVar9) >> 0x10) +
                            (ulong)bVar5 * (long)iVar9)) >> (0x15 - bVar4 & 0x3f));
      qcoeff_ptr[sVar1] = (uVar8 ^ uVar12) - uVar8;
      if (iqm_ptr == (qm_val_t *)0x0) {
        uVar7 = 0x20;
      }
      else {
        uVar7 = (uint)iqm_ptr[sVar1];
      }
      dqcoeff_ptr[sVar1] =
           ((int)(((int)((int)dequant_ptr[bVar14] * uVar7 + 0x10) >> 5) * uVar12) >> (bVar4 & 0x1f)
           ^ uVar8) - uVar8;
      if (uVar12 != 0) {
        if (uVar6 == 0xffffffff) {
          uVar6 = (uint)uVar11;
        }
        uVar3 = uVar11 & 0xffffffff;
      }
    }
    uVar8 = (uint)uVar3;
    uVar11 = uVar11 + 1;
  } while ((uVar2 & 0x7fffffff) != uVar11);
  if (uVar6 == uVar8 && -1 < (int)uVar8) {
    sVar1 = scan[uVar6];
    uVar8 = uVar6;
    if ((qcoeff_ptr[sVar1] == 1) || (qcoeff_ptr[sVar1] == -1)) {
      if (qm_ptr == (qm_val_t *)0x0) {
        uVar2 = 0x20;
      }
      else {
        uVar2 = (uint)qm_ptr[sVar1];
      }
      uVar3 = (ulong)(sVar1 != 0);
      iVar10 = dequant_ptr[uVar3] * 0x20d + 0x40 >> 7;
      if (((int)(uVar2 * coeff_ptr[sVar1]) < local_64[uVar3] * 0x20 + iVar10) &&
         (local_64[uVar3 + 3] * 0x20 - iVar10 < (int)(uVar2 * coeff_ptr[sVar1]))) {
        qcoeff_ptr[sVar1] = 0;
        dqcoeff_ptr[sVar1] = 0;
LAB_0026d3e0:
        uVar8 = 0xffffffff;
      }
    }
  }
  *eob_ptr = (short)uVar8 + 1;
  return;
}

Assistant:

void aom_quantize_b_adaptive_helper_c(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan, const qm_val_t *qm_ptr,
    const qm_val_t *iqm_ptr, const int log_scale) {
  const int zbins[2] = { ROUND_POWER_OF_TWO(zbin_ptr[0], log_scale),
                         ROUND_POWER_OF_TWO(zbin_ptr[1], log_scale) };
  const int nzbins[2] = { zbins[0] * -1, zbins[1] * -1 };
  int i, non_zero_count = (int)n_coeffs, eob = -1;
  (void)iscan;

  memset(qcoeff_ptr, 0, n_coeffs * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, n_coeffs * sizeof(*dqcoeff_ptr));

  int prescan_add[2];
  for (i = 0; i < 2; ++i)
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);

  // Pre-scan pass
  for (i = (int)n_coeffs - 1; i >= 0; i--) {
    const int rc = scan[i];
    const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
    const int coeff = coeff_ptr[rc] * wt;
    const int prescan_add_val = prescan_add[rc != 0];
    if (coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val) &&
        coeff > (nzbins[rc != 0] * (1 << AOM_QM_BITS) - prescan_add_val))
      non_zero_count--;
    else
      break;
  }

  // Quantization pass: All coefficients with index >= zero_flag are
  // skippable. Note: zero_flag can be zero.
#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif  // SKIP_EOB_FACTOR_ADJUST
  for (i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int coeff = coeff_ptr[rc];
    const int coeff_sign = AOMSIGN(coeff);
    const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
    int tmp32;

    const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
    if (abs_coeff * wt >= (zbins[rc != 0] << AOM_QM_BITS)) {
      int64_t tmp =
          clamp(abs_coeff + ROUND_POWER_OF_TWO(round_ptr[rc != 0], log_scale),
                INT16_MIN, INT16_MAX);
      tmp *= wt;
      tmp32 = (int)(((((tmp * quant_ptr[rc != 0]) >> 16) + tmp) *
                     quant_shift_ptr[rc != 0]) >>
                    (16 - log_scale + AOM_QM_BITS));  // quantization
      qcoeff_ptr[rc] = (tmp32 ^ coeff_sign) - coeff_sign;
      const int iwt = iqm_ptr != NULL ? iqm_ptr[rc] : (1 << AOM_QM_BITS);
      const int dequant =
          (dequant_ptr[rc != 0] * iwt + (1 << (AOM_QM_BITS - 1))) >>
          AOM_QM_BITS;
      const tran_low_t abs_dqcoeff = (tmp32 * dequant) >> log_scale;
      dqcoeff_ptr[rc] = (tran_low_t)((abs_dqcoeff ^ coeff_sign) - coeff_sign);

      if (tmp32) {
        eob = i;
#if SKIP_EOB_FACTOR_ADJUST
        if (first == -1) first = i;
#endif  // SKIP_EOB_FACTOR_ADJUST
      }
    }
  }
#if SKIP_EOB_FACTOR_ADJUST
  if (eob >= 0 && first == eob) {
    const int rc = scan[eob];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
      const int coeff = coeff_ptr[rc] * wt;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val) &&
          coeff > (nzbins[rc != 0] * (1 << AOM_QM_BITS) - prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        eob = -1;
      }
    }
  }
#endif  // SKIP_EOB_FACTOR_ADJUST
  *eob_ptr = eob + 1;
}